

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::WriteProjectLine
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmGeneratorTarget *target,
          string *rootBinaryDir)

{
  cmValue local;
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  undefined1 local_b8 [8];
  string path;
  string local_90;
  cmValue local_70;
  cmValue projType;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue projFile;
  string *rootBinaryDir_local;
  cmGeneratorTarget *target_local;
  ostream *fout_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  projFile.Value = rootBinaryDir;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"GENERATOR_FILE_NAME",&local_51);
  local_30 = cmGeneratorTarget::GetProperty(target,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"GENERATOR_FILE_NAME_EXT",
             (allocator<char> *)(path.field_2._M_local_buf + 0xf));
  local_70 = cmGeneratorTarget::GetProperty(target,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)(path.field_2._M_local_buf + 0xf));
  bVar1 = cmValue::operator_cast_to_bool(&local_30);
  if ((bVar1) && (bVar1 = cmValue::operator_cast_to_bool(&local_70), local = projFile, bVar1)) {
    psVar2 = cmValue::operator_cast_to_string_(&local_30);
    cmSystemTools::RelativePath((string *)local_b8,local.Value,psVar2);
    std::operator<<(fout,(string *)local_b8);
    poVar3 = std::operator<<(fout,' ');
    psVar2 = cmValue::operator*[abi_cxx11_(&local_70);
    poVar3 = std::operator<<(poVar3,(string *)psVar2);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)local_b8);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteProjectLine(
  std::ostream& fout, cmGeneratorTarget const* target,
  std::string& rootBinaryDir)
{
  cmValue projFile = target->GetProperty("GENERATOR_FILE_NAME");
  cmValue projType = target->GetProperty("GENERATOR_FILE_NAME_EXT");
  /* If either value is not valid then this particular target is an
   * unsupported target type and should be skipped.
   */
  if (projFile && projType) {
    std::string path = cmSystemTools::RelativePath(rootBinaryDir, projFile);

    fout << path;
    fout << ' ' << *projType << '\n';
  }
}